

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  float fVar1;
  ImVec2 padding;
  ImGuiContext *g;
  ImRect r_screen;
  float local_3c;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiContext *local_20;
  ImRect local_10;
  
  local_20 = GImGui;
  GetMainViewport();
  local_10 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)0x143205);
  local_28 = (local_20->Style).DisplaySafeAreaPadding;
  fVar1 = ImRect::GetWidth(&local_10);
  if (fVar1 <= local_28.x * 2.0) {
    local_34 = 0.0;
  }
  else {
    local_34 = -local_28.x;
  }
  fVar1 = ImRect::GetHeight(&local_10);
  if (fVar1 <= local_28.y * 2.0) {
    local_3c = 0.0;
  }
  else {
    local_3c = -local_28.y;
  }
  ImVec2::ImVec2(&local_30,local_34,local_3c);
  ImRect::Expand(&local_10,&local_30);
  return local_10;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}